

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpcpp.hpp
# Opt level: O0

string * __thiscall
jsonrpcpp::Entity::type_str_abi_cxx11_(string *__return_storage_ptr__,Entity *this)

{
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  Entity *local_18;
  Entity *this_local;
  
  local_18 = this;
  this_local = (Entity *)__return_storage_ptr__;
  switch(this->entity) {
  case unknown:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"unknown",&local_19);
    std::allocator<char>::~allocator(&local_19);
    break;
  case exception:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"exception",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case id:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"id",local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  case error:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"error",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case response:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"response",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  case request:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"request",&local_31);
    std::allocator<char>::~allocator(&local_31);
    break;
  case notification:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"notification",&local_32);
    std::allocator<char>::~allocator(&local_32);
    break;
  case batch:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"batch",&local_33);
    std::allocator<char>::~allocator(&local_33);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"unknown",&local_34);
    std::allocator<char>::~allocator(&local_34);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string Entity::type_str() const
{
    switch (entity)
    {
        case entity_t::unknown:
            return "unknown";
        case entity_t::id:
            return "id";
        case entity_t::exception:
            return "exception";
        case entity_t::error:
            return "error";
        case entity_t::response:
            return "response";
        case entity_t::request:
            return "request";
        case entity_t::notification:
            return "notification";
        case entity_t::batch:
            return "batch";
        default:
            return "unknown";
    }
}